

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  pointer *ppcVar1;
  LineOrder LVar2;
  Compression CVar3;
  pthread_mutex_t *__mutex;
  Data *pDVar4;
  size_t __n;
  uint64_t sampleCountTableSize;
  uint64_t packedDataSize;
  uint64_t unpackedDataSize;
  OutputStreamMutex *filedata;
  bool bVar5;
  int iVar6;
  value_type_conflict *__val;
  Header *this_00;
  string *psVar7;
  Box2i *pBVar8;
  Box2i *pBVar9;
  LineOrder *pLVar10;
  Compression *pCVar11;
  ChannelList *this_01;
  ChannelList *other;
  ArgExc *pAVar12;
  char *pcVar13;
  ostream *poVar14;
  LogicExc *this_02;
  undefined4 in_ECX;
  pointer pcVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint64_t dataSize;
  pthread_mutex_t *local_1c8;
  DeepScanLineOutputFile *local_1c0;
  vector<char,_std::allocator<char>_> data;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pDVar4 = this->_data;
  local_1c8 = __mutex;
  this_00 = DeepScanLineInputFile::header(in);
  bVar5 = Header::hasType(this_00);
  if (bVar5) {
    psVar7 = Header::type_abi_cxx11_(this_00);
    __n = psVar7->_M_string_length;
    if ((__n == DAT_001e9c48) &&
       ((__n == 0 ||
        (iVar6 = bcmp((psVar7->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n), iVar6 == 0)))) {
      pBVar8 = Header::dataWindow(&pDVar4->header);
      pBVar9 = Header::dataWindow(this_00);
      iVar6 = -(uint)((pBVar9->min).x == (pBVar8->min).x);
      iVar18 = -(uint)((pBVar9->min).y == (pBVar8->min).y);
      auVar16._4_4_ = iVar6;
      auVar16._0_4_ = iVar6;
      auVar16._8_4_ = iVar18;
      auVar16._12_4_ = iVar18;
      iVar6 = movmskpd(in_ECX,auVar16);
      if ((iVar6 != 3) ||
         (iVar6 = -(uint)((pBVar9->max).x == (pBVar8->max).x),
         iVar18 = -(uint)((pBVar9->max).y == (pBVar8->max).y), auVar17._4_4_ = iVar6,
         auVar17._0_4_ = iVar6, auVar17._8_4_ = iVar18, auVar17._12_4_ = iVar18,
         iVar6 = movmskpd((int)pBVar9,auVar17), iVar6 != 3)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppcVar1,"Cannot copy pixels from image file \"",0x24);
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
        pcVar13 = OStream::fileName(this->_data->_streamData->os);
        poVar14 = std::operator<<(poVar14,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\". The files have different data windows.",0x29);
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
        __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pLVar10 = Header::lineOrder(&pDVar4->header);
      LVar2 = *pLVar10;
      pLVar10 = Header::lineOrder(this_00);
      if (LVar2 != *pLVar10) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppcVar1,"Quick pixel copy from image file \"",0x22);
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
        pcVar13 = OStream::fileName(this->_data->_streamData->os);
        poVar14 = std::operator<<(poVar14,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" failed. The files have different line orders.",0x2f);
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
        __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pCVar11 = Header::compression(&pDVar4->header);
      CVar3 = *pCVar11;
      pCVar11 = Header::compression(this_00);
      if (CVar3 == *pCVar11) {
        this_01 = Header::channels(&pDVar4->header);
        other = Header::channels(this_00);
        bVar5 = ChannelList::operator==(this_01,other);
        if (!bVar5) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&data);
          ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppcVar1,"Quick pixel copy from image file \"",0x22);
          pcVar13 = DeepScanLineInputFile::fileName(in);
          poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
          pcVar13 = OStream::fileName(this->_data->_streamData->os);
          poVar14 = std::operator<<(poVar14,pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"\" failed.  The files have different channel lists.",0x32);
          pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
          __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        pBVar8 = Header::dataWindow(&pDVar4->header);
        if (this->_data->missingScanLines == ((pBVar8->max).y - (pBVar8->min).y) + 1) {
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)operator_new(0x1000);
          pcVar15 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + 0x1000;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pcVar15;
          memset(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,0,0x1000);
          pDVar4 = this->_data;
          iVar6 = pDVar4->missingScanLines;
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = pcVar15;
          while (0 < iVar6) {
            dataSize = (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
            local_1c0 = this;
            DeepScanLineInputFile::rawPixelData
                      (in,pDVar4->currentScanLine,
                       data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&dataSize);
            if ((ulong)((long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < dataSize) {
              std::vector<char,_std::allocator<char>_>::resize(&data,dataSize);
              DeepScanLineInputFile::rawPixelData
                        (in,this->_data->currentScanLine,
                         data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&dataSize);
            }
            pcVar15 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            sampleCountTableSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 4);
            packedDataSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc);
            unpackedDataSize =
                 *(uint64_t *)
                  (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x14);
            pDVar4 = this->_data;
            filedata = pDVar4->_streamData;
            iVar6 = lineBufferMinY(pDVar4->currentScanLine,pDVar4->minY,pDVar4->linesInBuffer);
            anon_unknown_7::writePixelData
                      (filedata,pDVar4,iVar6,pcVar15 + sampleCountTableSize + 0x1c,packedDataSize,
                       unpackedDataSize,pcVar15 + 0x1c,sampleCountTableSize);
            pDVar4 = local_1c0->_data;
            iVar6 = pDVar4->linesInBuffer;
            iVar18 = -iVar6;
            if (pDVar4->lineOrder == INCREASING_Y) {
              iVar18 = iVar6;
            }
            pDVar4->currentScanLine = pDVar4->currentScanLine + iVar18;
            pDVar4->missingScanLines = pDVar4->missingScanLines - iVar6;
            pDVar4 = local_1c0->_data;
            this = local_1c0;
            iVar6 = pDVar4->missingScanLines;
          }
          if (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start != (char *)0x0) {
            operator_delete(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pthread_mutex_unlock(local_1c8);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppcVar1,"Quick pixel copy from image file \"",0x22);
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
        pcVar13 = OStream::fileName(this->_data->_streamData->os);
        poVar14 = std::operator<<(poVar14,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" failed. \"",0xb);
        pcVar13 = OStream::fileName(this->_data->_streamData->os);
        poVar14 = std::operator<<(poVar14,pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" already contains pixel data.",0x1e);
        this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::LogicExc::LogicExc(this_02,(stringstream *)&data);
        __cxa_throw(this_02,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&data);
      ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppcVar1,"Quick pixel copy from image file \"",0x22);
      pcVar13 = DeepScanLineInputFile::fileName(in);
      poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
      pcVar13 = OStream::fileName(this->_data->_streamData->os);
      poVar14 = std::operator<<(poVar14,pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" failed. The files use different compression methods.",0x36);
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
      __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  ppcVar1 = &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppcVar1,"Cannot copy pixels from image file \"",0x24);
  pcVar13 = DeepScanLineInputFile::fileName(in);
  poVar14 = std::operator<<((ostream *)ppcVar1,pcVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
  pcVar13 = OStream::fileName(this->_data->_streamData->os);
  poVar14 = std::operator<<(poVar14,pcVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"\": the input needs to be a deep scanline image",0x2e);
  pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)&data);
  __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!inHdr.hasType () || inHdr.type () != DEEPSCANLINE)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data (4096);

    while (_data->missingScanLines > 0)
    {
        uint64_t dataSize = (uint64_t) data.size ();
        in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize (dataSize);
            in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData

        bytesOruint64_t tmp;
        memcpy (&tmp.b, &data[4], 8);
        uint64_t packedSampleCountSize = tmp.i;

        memcpy (&tmp.b, &data[12], 8);
        uint64_t packedDataSize = tmp.i;

        memcpy (&tmp.b, &data[20], 8);
        uint64_t unpackedDataSize = tmp.i;

        const char* sampleCountTable = &data[0] + 28;
        const char* pixelData        = sampleCountTable + packedSampleCountSize;

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            packedDataSize,
            unpackedDataSize,
            sampleCountTable,
            packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}